

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreCubeAddToList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t GVar1;
  Gia_StaAre_t *pGVar2;
  int fVerbose;
  Gia_StaAre_t *pSta_local;
  Gia_PtrAre_t *pRoot_local;
  Gia_ManAre_t *p_local;
  
  pSta->iNext = *pRoot;
  GVar1 = Gia_Int2Ptr(p->nStas - 1);
  *pRoot = GVar1;
  pGVar2 = Gia_ManAreSta(p,*pRoot);
  if (pSta != pGVar2) {
    __assert_fail("pSta == Gia_ManAreSta(p, *pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x415,
                  "void Gia_ManAreCubeAddToList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
  }
  return;
}

Assistant:

static inline void Gia_ManAreCubeAddToList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    pSta->iNext = *pRoot;
    *pRoot = Gia_Int2Ptr( p->nStas - 1 );
    assert( pSta == Gia_ManAreSta(p, *pRoot) );
if ( fVerbose )
{
printf( "Adding cube: " );
Gia_ManArePrintCube( p, pSta );
//printf( "\n" );
}
}